

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cpp
# Opt level: O1

double __thiscall
icu_63::double_conversion::StringToDoubleConverter::StringToIeee<unsigned_short_const*>
          (StringToDoubleConverter *this,unsigned_short *input,int length,bool read_as_double,
          int *processed_characters_count)

{
  unsigned_short *puVar1;
  unsigned_short uVar2;
  ushort uVar3;
  double dVar4;
  undefined1 auVar5 [16];
  int *piVar6;
  long lVar7;
  unsigned_short *puVar8;
  bool bVar9;
  bool bVar10;
  unsigned_short uVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  undefined7 in_register_00000009;
  long lVar15;
  int iVar16;
  unsigned_short *puVar17;
  byte bVar18;
  ulong uVar19;
  unsigned_short *puVar20;
  uint uVar21;
  int iVar22;
  byte bVar23;
  char cVar24;
  undefined4 in_XMM0_Da;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  float fVar25;
  undefined4 in_XMM0_Db;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  Vector<const_char> buffer_00;
  Vector<const_char> buffer_01;
  bool result_is_junk_1;
  char *start;
  char buffer [782];
  unsigned_short *local_3a8;
  uint local_39c;
  undefined1 local_398 [16];
  unsigned_short *local_388;
  int *local_380;
  int local_374;
  unsigned_short *local_370;
  int local_368;
  bool local_361;
  unsigned_short *local_360;
  unsigned_short *local_358;
  double_conversion *local_350;
  double_conversion local_348 [792];
  
  *processed_characters_count = 0;
  if (length == 0) {
    return this->empty_string_value_;
  }
  local_374 = (int)CONCAT71(in_register_00000009,read_as_double);
  uVar21 = this->flags_;
  local_3a8 = input;
  if ((uVar21 & 0x18) != 0) {
    bVar9 = isWhitespace((uint)*input);
    in_XMM0_Da = extraout_XMM0_Da;
    in_XMM0_Db = extraout_XMM0_Db;
    if (bVar9) {
      lVar15 = (long)length * 2;
      puVar8 = input + 1;
      local_388 = input;
      do {
        puVar20 = puVar8;
        lVar15 = lVar15 + -2;
        if (lVar15 == 0) goto LAB_00251e9c;
        bVar9 = isWhitespace((uint)*puVar20);
        puVar8 = puVar20 + 1;
      } while (bVar9);
      input = local_388;
      in_XMM0_Da = extraout_XMM0_Da_00;
      in_XMM0_Db = extraout_XMM0_Db_00;
      local_3a8 = puVar20;
      if (lVar15 == 0) {
LAB_00251e9c:
        *processed_characters_count = (int)((ulong)((long)puVar20 - (long)local_388) >> 1);
        return this->empty_string_value_;
      }
    }
    if (((uVar21 & 8) == 0) && (local_3a8 != input)) {
      return this->junk_string_value_;
    }
  }
  puVar20 = local_3a8;
  local_398._0_4_ = uVar21;
  puVar8 = input + length;
  uVar2 = *local_3a8;
  local_388 = input;
  local_380 = processed_characters_count;
  if ((uVar2 == 0x2d) || (uVar2 == 0x2b)) {
    local_39c = (uint)CONCAT11((char)(uVar2 >> 8),uVar2 == 0x2d);
    puVar17 = local_3a8 + 1;
    lVar15 = 2;
    bVar9 = puVar17 != puVar8;
    if ((bVar9) &&
       (puVar1 = local_3a8 + 1, local_3a8 = puVar17, bVar10 = isWhitespace((uint)*puVar1),
       in_XMM0_Da = extraout_XMM0_Da_01, in_XMM0_Db = extraout_XMM0_Db_01, puVar17 = local_3a8,
       bVar10)) {
      lVar7 = 4;
      do {
        lVar15 = lVar7;
        bVar10 = (unsigned_short *)((long)puVar20 + lVar15) == puVar8;
        bVar9 = !bVar10;
        puVar17 = local_3a8;
        if (bVar10) break;
        bVar10 = isWhitespace((uint)*(ushort *)((long)puVar20 + lVar15));
        lVar7 = lVar15 + 2;
        in_XMM0_Da = extraout_XMM0_Da_02;
        in_XMM0_Db = extraout_XMM0_Db_02;
        puVar17 = local_3a8;
      } while (bVar10);
    }
    local_3a8 = puVar17;
    if ((bVar9) && (lVar15 == 2 || (char)((local_398._0_4_ & 0x20) >> 5) != '\0')) {
      local_3a8 = (unsigned_short *)((long)puVar20 + lVar15);
      bVar9 = true;
    }
    else {
      in_XMM0_Da = SUB84(this->junk_string_value_,0);
      in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
      bVar9 = false;
    }
    if (!bVar9) {
      return (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
    }
  }
  else {
    local_39c = 0;
  }
  piVar6 = local_380;
  auVar5 = local_398;
  pcVar12 = this->infinity_symbol_;
  if ((pcVar12 != (char *)0x0) && ((uint)*local_3a8 == (int)*pcVar12)) {
    do {
      puVar20 = local_3a8 + 1;
      pcVar12 = pcVar12 + 1;
      cVar24 = *pcVar12;
      local_3a8 = puVar20;
      if (cVar24 == '\0') goto LAB_00252281;
    } while ((puVar20 != puVar8) && ((uint)*puVar20 == (int)cVar24));
    if (cVar24 == '\0') {
LAB_00252281:
      if (puVar20 == puVar8 || (local_398 & (undefined1  [16])0x14) != (undefined1  [16])0x0) {
        if ((local_398 & (undefined1  [16])0x4) == (undefined1  [16])0x0) {
          bVar9 = puVar20 != puVar8;
          if ((bVar9) && (bVar10 = isWhitespace((uint)*puVar20), bVar10)) {
            do {
              puVar20 = puVar20 + 1;
              bVar9 = puVar20 != puVar8;
              if (puVar20 == puVar8) break;
              bVar10 = isWhitespace((uint)*puVar20);
            } while (bVar10);
          }
          local_3a8 = puVar20;
          if (bVar9) goto LAB_0025268f;
        }
        *local_380 = (int)((ulong)((long)local_3a8 - (long)local_388) >> 1);
        if ((char)local_39c == '\0') {
          return INFINITY;
        }
        return -INFINITY;
      }
    }
    goto LAB_0025268f;
  }
  pcVar12 = this->nan_symbol_;
  if ((pcVar12 != (char *)0x0) && ((uint)*local_3a8 == (int)*pcVar12)) {
    do {
      puVar20 = local_3a8 + 1;
      pcVar12 = pcVar12 + 1;
      cVar24 = *pcVar12;
      local_3a8 = puVar20;
      if (cVar24 == '\0') goto LAB_002523ae;
    } while ((puVar20 != puVar8) && ((uint)*puVar20 == (int)cVar24));
    if (cVar24 == '\0') {
LAB_002523ae:
      if (puVar20 == puVar8 || (local_398 & (undefined1  [16])0x14) != (undefined1  [16])0x0) {
        if ((local_398 & (undefined1  [16])0x4) == (undefined1  [16])0x0) {
          bVar9 = puVar20 != puVar8;
          if ((bVar9) && (bVar10 = isWhitespace((uint)*puVar20), bVar10)) {
            do {
              puVar20 = puVar20 + 1;
              bVar9 = puVar20 != puVar8;
              if (puVar20 == puVar8) break;
              bVar10 = isWhitespace((uint)*puVar20);
            } while (bVar10);
          }
          local_3a8 = puVar20;
          if (bVar9) goto LAB_0025268f;
        }
        *local_380 = (int)((ulong)((long)local_3a8 - (long)local_388) >> 1);
        if ((char)local_39c == '\0') {
          return NAN;
        }
        return -NAN;
      }
    }
    goto LAB_0025268f;
  }
  uVar2 = *local_3a8;
  iVar13 = 0;
  bVar23 = 0;
  bVar18 = local_398[0];
  if (uVar2 == 0x30) {
    puVar20 = local_3a8 + 1;
    if (puVar20 == puVar8) {
      uVar19 = (long)puVar20 - (long)local_388;
LAB_0025238d:
      *local_380 = (int)(uVar19 >> 1);
    }
    else {
      if (((local_398 & (undefined1  [16])0x1) != (undefined1  [16])0x0) &&
         ((*puVar20 | 0x20) == 0x78)) {
        local_3a8 = local_3a8 + 2;
        if ((local_3a8 != puVar8) &&
           ((uVar3 = *local_3a8, uVar3 < 0x40 && uVar3 - 0x30 < 10 ||
            ((uVar21 = uVar3 - 0x41, uVar21 < 0x26 &&
             ((0x3f0000003fU >> ((ulong)uVar21 & 0x3f) & 1) != 0)))))) {
          local_398._0_8_ =
               RadixStringToIeee<4,unsigned_short_const*>
                         (&local_3a8,puVar8,(bool)(char)local_39c,
                          SUB41((local_398._0_4_ & 4) >> 2,0),this->junk_string_value_,
                          local_374._0_1_,(bool *)local_348);
          puVar20 = local_3a8;
          if (local_348[0] != (double_conversion)0x0) {
            return (double)local_398._0_8_;
          }
          if (local_3a8 != puVar8 && (auVar5 & (undefined1  [16])0x10) != (undefined1  [16])0x0) {
            local_398._8_4_ = extraout_XMM0_Dc;
            local_398._12_4_ = extraout_XMM0_Dd;
            bVar9 = isWhitespace((uint)*local_3a8);
            if (bVar9) {
              do {
                puVar20 = puVar20 + 1;
                if (puVar20 == puVar8) break;
                bVar9 = isWhitespace((uint)*puVar20);
              } while (bVar9);
            }
          }
          local_3a8 = puVar20;
          *piVar6 = (int)((ulong)((long)local_3a8 - (long)local_388) >> 1);
          return (double)local_398._0_8_;
        }
        goto LAB_0025268f;
      }
      uVar19 = (long)puVar20 - (long)local_388;
      do {
        if (*puVar20 != 0x30) {
          bVar23 = bVar18 >> 1;
          local_3a8 = puVar20;
          goto LAB_00251fb6;
        }
        puVar20 = puVar20 + 1;
        uVar19 = uVar19 + 2;
      } while (puVar20 != puVar8);
      *local_380 = (int)(uVar19 >> 1);
    }
    if ((bool)(char)local_39c == false) {
      return 0.0;
    }
    return -0.0;
  }
LAB_00251fb6:
  iVar22 = 0;
  bVar9 = false;
  uVar21 = 0;
  do {
    uVar11 = *local_3a8;
    if (9 < (ushort)(uVar11 - 0x30)) {
      if (iVar13 == 0) {
        bVar23 = 0;
      }
      iVar16 = 0;
      if (uVar11 != 0x2e) goto LAB_002524bf;
      if (((~bVar23 | bVar18 >> 2) & 1) == 0) goto LAB_0025268f;
      iVar16 = 0;
      puVar20 = local_3a8;
      if ((bVar23 & 1) != 0) goto LAB_00252022;
      puVar20 = local_3a8 + 1;
      if (puVar20 == puVar8) {
        local_3a8 = puVar20;
        if ((iVar13 != 0) || (iVar16 = 0, uVar2 == 0x30)) goto LAB_00252026;
        goto LAB_0025268f;
      }
      iVar16 = 0;
      if ((iVar13 != 0) || (iVar16 = 0, *puVar20 != 0x30)) goto LAB_00252230;
      uVar19 = (long)(local_3a8 + 2) - (long)local_388;
      iVar16 = 0;
      puVar17 = local_3a8 + 2;
      goto LAB_00252204;
    }
    if (iVar13 < 0x304) {
      lVar15 = (long)(int)uVar21;
      uVar21 = uVar21 + 1;
      local_348[lVar15] = SUB21(uVar11,0);
      iVar13 = iVar13 + 1;
    }
    else {
      iVar22 = iVar22 + 1;
      bVar9 = (bool)(uVar11 != 0x30 | bVar9);
    }
    if ((bVar23 & 1) == 0) {
      bVar23 = false;
    }
    else {
      bVar23 = *local_3a8 < 0x38;
    }
    local_3a8 = local_3a8 + 1;
  } while (local_3a8 != puVar8);
  iVar16 = 0;
  puVar20 = local_3a8;
  goto LAB_00252022;
LAB_002524bf:
  if ((iVar13 == 0 && iVar16 == 0) && uVar2 != 0x30) goto LAB_0025268f;
  if ((*local_3a8 | 0x20) == 0x65) {
    if (((~bVar23 | bVar18 >> 2) & 1) == 0) goto LAB_0025268f;
    puVar20 = local_3a8;
    if ((bVar23 & 1) == 0) {
      puVar20 = local_3a8 + 1;
      if (puVar20 == puVar8) {
        local_3a8 = puVar20;
        if ((local_398 & (undefined1  [16])0x4) == (undefined1  [16])0x0) goto LAB_0025268f;
        goto LAB_00252026;
      }
      uVar2 = *puVar20;
      if ((((uVar2 == 0x2d) || (uVar11 = 0x2b, uVar2 == 0x2b)) &&
          (local_3a8 = local_3a8 + 2, puVar20 = local_3a8, uVar11 = uVar2, local_3a8 == puVar8)) ||
         ((local_3a8 = puVar20, local_3a8 == puVar8 || ((ushort)(*local_3a8 - 0x3a) < 0xfff6)))) {
        iVar13 = 6;
        if ((local_398 & (undefined1  [16])0x4) == (undefined1  [16])0x0) {
          in_XMM0_Da = SUB84(this->junk_string_value_,0);
          in_XMM0_Db = (undefined4)((ulong)this->junk_string_value_ >> 0x20);
          iVar13 = 1;
        }
      }
      else {
        iVar13 = 0;
        puVar20 = local_3a8;
        do {
          local_3a8 = puVar20 + 1;
          if ((iVar13 < 0x6666666) ||
             ((iVar14 = 0x3fffffff, iVar13 == 0x6666666 && (*puVar20 < 0x34)))) {
            iVar14 = (uint)*puVar20 + iVar13 * 10 + -0x30;
          }
          iVar13 = iVar14;
        } while ((local_3a8 != puVar8) && (puVar20 = local_3a8, (ushort)(*local_3a8 - 0x30) < 10));
        iVar14 = -iVar13;
        if ((char)uVar11 != '-') {
          iVar14 = iVar13;
        }
        iVar16 = iVar16 + iVar14;
        iVar13 = 0;
      }
      puVar20 = local_3a8;
      if (iVar13 != 6) {
        if (iVar13 != 0) {
          return (double)CONCAT44(in_XMM0_Db,in_XMM0_Da);
        }
        goto LAB_002525f8;
      }
    }
  }
  else {
LAB_002525f8:
    if (local_3a8 != puVar8 && (local_398 & (undefined1  [16])0x14) == (undefined1  [16])0x0) {
LAB_0025268f:
      return this->junk_string_value_;
    }
    local_368 = iVar16;
    if ((local_398 & (undefined1  [16])0x4) == (undefined1  [16])0x0) {
      cVar24 = local_3a8 != puVar8;
      if ((bool)cVar24) {
        local_360 = (unsigned_short *)CONCAT71(local_360._1_7_,cVar24);
        local_370 = local_3a8;
        local_358 = local_3a8;
        bVar10 = isWhitespace((uint)*local_3a8);
        puVar17 = local_370;
        puVar20 = local_358;
        if (bVar10) {
          do {
            puVar17 = puVar20 + 1;
            local_360 = (unsigned_short *)CONCAT71(local_360._1_7_,puVar17 != puVar8);
            if (puVar17 == puVar8) break;
            local_370 = puVar17;
            bVar10 = isWhitespace((uint)*puVar17);
            puVar17 = local_370;
            puVar20 = local_370;
          } while (bVar10);
        }
        cVar24 = (char)local_360;
        local_3a8 = puVar17;
      }
      if (cVar24 != '\0') goto LAB_0025268f;
    }
    iVar16 = local_368;
    puVar20 = local_3a8;
    if (local_3a8 != puVar8 && (local_398 & (undefined1  [16])0x10) != (undefined1  [16])0x0) {
      local_370 = local_3a8;
      local_360 = local_3a8;
      bVar10 = isWhitespace((uint)*local_3a8);
      iVar16 = local_368;
      puVar17 = local_360;
      puVar20 = local_370;
      if (bVar10) {
        do {
          puVar20 = puVar17 + 1;
          iVar16 = local_368;
          if (puVar20 == puVar8) break;
          local_370 = puVar20;
          bVar10 = isWhitespace((uint)*puVar20);
          iVar16 = local_368;
          puVar17 = local_370;
          puVar20 = local_370;
        } while (bVar10);
      }
    }
  }
  goto LAB_00252022;
LAB_00252204:
  do {
    puVar20 = puVar17;
    if (puVar20 == puVar8) goto LAB_0025238d;
    iVar16 = iVar16 + -1;
    uVar19 = uVar19 + 2;
    puVar17 = puVar20 + 1;
  } while (*puVar20 == 0x30);
LAB_00252230:
  do {
    uVar11 = *puVar20;
    local_3a8 = puVar20;
    if (9 < (ushort)(uVar11 - 0x30)) goto LAB_002524bf;
    if (iVar13 < 0x304) {
      lVar15 = (long)(int)uVar21;
      uVar21 = uVar21 + 1;
      local_348[lVar15] = SUB21(uVar11,0);
      iVar13 = iVar13 + 1;
      iVar16 = iVar16 + -1;
    }
    else {
      bVar9 = (bool)(uVar11 != 0x30 | bVar9);
    }
    puVar20 = puVar20 + 1;
  } while (puVar20 != puVar8);
LAB_00252022:
  local_3a8 = puVar20;
LAB_00252026:
  piVar6 = local_380;
  bVar10 = (bool)(char)local_39c;
  if ((bVar23 & 1) != 0) {
    local_350 = local_348;
    dVar4 = RadixStringToIeee<3,char*>
                      ((char **)&local_350,(char *)(local_348 + (int)uVar21),(bool)(char)local_39c,
                       SUB41((local_398._0_4_ & 4) >> 2,0),this->junk_string_value_,local_374._0_1_,
                       &local_361);
    *local_380 = (int)((ulong)((long)local_3a8 - (long)local_388) >> 1);
    return dVar4;
  }
  iVar16 = iVar16 + iVar22;
  if (bVar9) {
    lVar15 = (long)(int)uVar21;
    uVar21 = uVar21 + 1;
    local_348[lVar15] = (double_conversion)0x31;
    iVar16 = iVar16 + -1;
  }
  local_348[(int)uVar21] = (double_conversion)0x0;
  buffer_00.start_ = (ulong)uVar21;
  if (local_374._0_1_ == false) {
    buffer_01.length_ = iVar16;
    buffer_01.start_ = (char *)buffer_00.start_;
    buffer_01._12_4_ = 0;
    fVar25 = Strtof(local_348,buffer_01,local_374);
    dVar4 = (double)fVar25;
  }
  else {
    buffer_00.length_ = iVar16;
    buffer_00._12_4_ = 0;
    dVar4 = Strtod(local_348,buffer_00,local_374);
  }
  *piVar6 = (int)((ulong)((long)local_3a8 - (long)local_388) >> 1);
  if (bVar10 == false) {
    return dVar4;
  }
  return -dVar4;
}

Assistant:

double StringToDoubleConverter::StringToIeee(
    Iterator input,
    int length,
    bool read_as_double,
    int* processed_characters_count) const {
  Iterator current = input;
  Iterator end = input + length;

  *processed_characters_count = 0;

  const bool allow_trailing_junk = (flags_ & ALLOW_TRAILING_JUNK) != 0;
  const bool allow_leading_spaces = (flags_ & ALLOW_LEADING_SPACES) != 0;
  const bool allow_trailing_spaces = (flags_ & ALLOW_TRAILING_SPACES) != 0;
  const bool allow_spaces_after_sign = (flags_ & ALLOW_SPACES_AFTER_SIGN) != 0;

  // To make sure that iterator dereferencing is valid the following
  // convention is used:
  // 1. Each '++current' statement is followed by check for equality to 'end'.
  // 2. If AdvanceToNonspace returned false then current == end.
  // 3. If 'current' becomes equal to 'end' the function returns or goes to
  // 'parsing_done'.
  // 4. 'current' is not dereferenced after the 'parsing_done' label.
  // 5. Code before 'parsing_done' may rely on 'current != end'.
  if (current == end) return empty_string_value_;

  if (allow_leading_spaces || allow_trailing_spaces) {
    if (!AdvanceToNonspace(&current, end)) {
      *processed_characters_count = static_cast<int>(current - input);
      return empty_string_value_;
    }
    if (!allow_leading_spaces && (input != current)) {
      // No leading spaces allowed, but AdvanceToNonspace moved forward.
      return junk_string_value_;
    }
  }

  // The longest form of simplified number is: "-<significant digits>.1eXXX\0".
  const int kBufferSize = kMaxSignificantDigits + 10;
  char buffer[kBufferSize];  // NOLINT: size is known at compile time.
  int buffer_pos = 0;

  // Exponent will be adjusted if insignificant digits of the integer part
  // or insignificant leading zeros of the fractional part are dropped.
  int exponent = 0;
  int significant_digits = 0;
  int insignificant_digits = 0;
  bool nonzero_digit_dropped = false;

  bool sign = false;

  if (*current == '+' || *current == '-') {
    sign = (*current == '-');
    ++current;
    Iterator next_non_space = current;
    // Skip following spaces (if allowed).
    if (!AdvanceToNonspace(&next_non_space, end)) return junk_string_value_;
    if (!allow_spaces_after_sign && (current != next_non_space)) {
      return junk_string_value_;
    }
    current = next_non_space;
  }

  if (infinity_symbol_ != NULL) {
    if (*current == infinity_symbol_[0]) {
      if (!ConsumeSubString(&current, end, infinity_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::Infinity() : Double::Infinity();
    }
  }

  if (nan_symbol_ != NULL) {
    if (*current == nan_symbol_[0]) {
      if (!ConsumeSubString(&current, end, nan_symbol_)) {
        return junk_string_value_;
      }

      if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
        return junk_string_value_;
      }
      if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
        return junk_string_value_;
      }

      ASSERT(buffer_pos == 0);
      *processed_characters_count = static_cast<int>(current - input);
      return sign ? -Double::NaN() : Double::NaN();
    }
  }

  bool leading_zero = false;
  if (*current == '0') {
    ++current;
    if (current == end) {
      *processed_characters_count = static_cast<int>(current - input);
      return SignedZero(sign);
    }

    leading_zero = true;

    // It could be hexadecimal value.
    if ((flags_ & ALLOW_HEX) && (*current == 'x' || *current == 'X')) {
      ++current;
      if (current == end || !isDigit(*current, 16)) {
        return junk_string_value_;  // "0x".
      }

      bool result_is_junk;
      double result = RadixStringToIeee<4>(&current,
                                           end,
                                           sign,
                                           allow_trailing_junk,
                                           junk_string_value_,
                                           read_as_double,
                                           &result_is_junk);
      if (!result_is_junk) {
        if (allow_trailing_spaces) AdvanceToNonspace(&current, end);
        *processed_characters_count = static_cast<int>(current - input);
      }
      return result;
    }

    // Ignore leading zeros in the integer part.
    while (*current == '0') {
      ++current;
      if (current == end) {
        *processed_characters_count = static_cast<int>(current - input);
        return SignedZero(sign);
      }
    }
  }

  bool octal = leading_zero && (flags_ & ALLOW_OCTALS) != 0;

  // Copy significant digits of the integer part (if any) to the buffer.
  while (*current >= '0' && *current <= '9') {
    if (significant_digits < kMaxSignificantDigits) {
      ASSERT(buffer_pos < kBufferSize);
      buffer[buffer_pos++] = static_cast<char>(*current);
      significant_digits++;
      // Will later check if it's an octal in the buffer.
    } else {
      insignificant_digits++;  // Move the digit into the exponential part.
      nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
    }
    octal = octal && *current < '8';
    ++current;
    if (current == end) goto parsing_done;
  }

  if (significant_digits == 0) {
    octal = false;
  }

  if (*current == '.') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;

    ++current;
    if (current == end) {
      if (significant_digits == 0 && !leading_zero) {
        return junk_string_value_;
      } else {
        goto parsing_done;
      }
    }

    if (significant_digits == 0) {
      // octal = false;
      // Integer part consists of 0 or is absent. Significant digits start after
      // leading zeros (if any).
      while (*current == '0') {
        ++current;
        if (current == end) {
          *processed_characters_count = static_cast<int>(current - input);
          return SignedZero(sign);
        }
        exponent--;  // Move this 0 into the exponent.
      }
    }

    // There is a fractional part.
    // We don't emit a '.', but adjust the exponent instead.
    while (*current >= '0' && *current <= '9') {
      if (significant_digits < kMaxSignificantDigits) {
        ASSERT(buffer_pos < kBufferSize);
        buffer[buffer_pos++] = static_cast<char>(*current);
        significant_digits++;
        exponent--;
      } else {
        // Ignore insignificant digits in the fractional part.
        nonzero_digit_dropped = nonzero_digit_dropped || *current != '0';
      }
      ++current;
      if (current == end) goto parsing_done;
    }
  }

  if (!leading_zero && exponent == 0 && significant_digits == 0) {
    // If leading_zeros is true then the string contains zeros.
    // If exponent < 0 then string was [+-]\.0*...
    // If significant_digits != 0 the string is not equal to 0.
    // Otherwise there are no digits in the string.
    return junk_string_value_;
  }

  // Parse exponential part.
  if (*current == 'e' || *current == 'E') {
    if (octal && !allow_trailing_junk) return junk_string_value_;
    if (octal) goto parsing_done;
    ++current;
    if (current == end) {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }
    char exponen_sign = '+';
    if (*current == '+' || *current == '-') {
      exponen_sign = static_cast<char>(*current);
      ++current;
      if (current == end) {
        if (allow_trailing_junk) {
          goto parsing_done;
        } else {
          return junk_string_value_;
        }
      }
    }

    if (current == end || *current < '0' || *current > '9') {
      if (allow_trailing_junk) {
        goto parsing_done;
      } else {
        return junk_string_value_;
      }
    }

    const int max_exponent = INT_MAX / 2;
    ASSERT(-max_exponent / 2 <= exponent && exponent <= max_exponent / 2);
    int num = 0;
    do {
      // Check overflow.
      int digit = *current - '0';
      if (num >= max_exponent / 10
          && !(num == max_exponent / 10 && digit <= max_exponent % 10)) {
        num = max_exponent;
      } else {
        num = num * 10 + digit;
      }
      ++current;
    } while (current != end && *current >= '0' && *current <= '9');

    exponent += (exponen_sign == '-' ? -num : num);
  }

  if (!(allow_trailing_spaces || allow_trailing_junk) && (current != end)) {
    return junk_string_value_;
  }
  if (!allow_trailing_junk && AdvanceToNonspace(&current, end)) {
    return junk_string_value_;
  }
  if (allow_trailing_spaces) {
    AdvanceToNonspace(&current, end);
  }

  parsing_done:
  exponent += insignificant_digits;

  if (octal) {
    double result;
    bool result_is_junk;
    char* start = buffer;
    result = RadixStringToIeee<3>(&start,
                                  buffer + buffer_pos,
                                  sign,
                                  allow_trailing_junk,
                                  junk_string_value_,
                                  read_as_double,
                                  &result_is_junk);
    ASSERT(!result_is_junk);
    *processed_characters_count = static_cast<int>(current - input);
    return result;
  }

  if (nonzero_digit_dropped) {
    buffer[buffer_pos++] = '1';
    exponent--;
  }

  ASSERT(buffer_pos < kBufferSize);
  buffer[buffer_pos] = '\0';

  double converted;
  if (read_as_double) {
    converted = Strtod(Vector<const char>(buffer, buffer_pos), exponent);
  } else {
    converted = Strtof(Vector<const char>(buffer, buffer_pos), exponent);
  }
  *processed_characters_count = static_cast<int>(current - input);
  return sign? -converted: converted;
}